

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::GeneratorsForTest::moveNext(GeneratorsForTest *this)

{
  bool bVar1;
  uint uVar2;
  iterator this_00;
  reference ppIVar3;
  vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_> *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
  local_18 [3];
  
  std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::begin(in_RDI);
  __gnu_cxx::
  __normal_iterator<Catch::IGeneratorInfo*const*,std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
  ::__normal_iterator<Catch::IGeneratorInfo**>
            (in_stack_ffffffffffffffd0,
             (__normal_iterator<Catch::IGeneratorInfo_**,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              *)in_RDI);
  this_00 = std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::end
                      (in_RDI);
  __gnu_cxx::
  __normal_iterator<Catch::IGeneratorInfo*const*,std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
  ::__normal_iterator<Catch::IGeneratorInfo**>
            ((__normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              *)this_00._M_current,
             (__normal_iterator<Catch::IGeneratorInfo_**,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
                        *)this_00._M_current,
                       (__normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
                        *)in_RDI);
    if (!bVar1) {
      return false;
    }
    ppIVar3 = __gnu_cxx::
              __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              ::operator*(local_18);
    uVar2 = (*(*ppIVar3)->_vptr_IGeneratorInfo[2])();
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
    ::operator++(local_18);
  }
  return true;
}

Assistant:

bool moveNext() {
            std::vector<IGeneratorInfo*>::const_iterator it = m_generatorsInOrder.begin();
            std::vector<IGeneratorInfo*>::const_iterator itEnd = m_generatorsInOrder.end();
            for(; it != itEnd; ++it ) {
                if( (*it)->moveNext() )
                    return true;
            }
            return false;
        }